

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::SeparateShaderTest
          (SeparateShaderTest *this,Context *ctx,string *name,string *description,int iterations,
          TestParams *params,TestFunc testFunc)

{
  TestLog *log;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  DataType DVar6;
  deRandom *rnd;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  DataType DVar11;
  VaryingInterpolation VVar12;
  VaryingInterpolation VVar13;
  int iVar14;
  Interpolation IVar15;
  undefined4 extraout_var;
  char *__lhs;
  TestParams *pTVar16;
  int location_;
  BindingKind BVar17;
  bool bVar18;
  undefined8 in_stack_00000010;
  int local_15c;
  deRandom *local_158;
  undefined8 uStack_150;
  SeparateShaderTest *local_140;
  TestParams *local_138;
  VaryingInterface *local_130;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *local_128;
  VarType varType;
  string ndxStr;
  string vtxName;
  string frgName;
  Layout local_a4;
  VariableDeclaration local_90;
  
  local_158 = (deRandom *)testFunc;
  uStack_150 = in_stack_00000010;
  local_138 = params;
  gles31::TestCase::TestCase
            (&this->super_TestCase,ctx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SeparateShaderTest_01e52d28;
  local_140 = this;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar8),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar16 = local_138;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SeparateShaderTest_01e52d28;
  *(int *)&(this->super_CallLogWrapper).field_0x14 = iterations;
  this->m_currentIteration = 0;
  bVar7 = local_138->switchVtx;
  bVar18 = local_138->switchFrg;
  bVar1 = local_138->useUniform;
  bVar2 = local_138->useSameName;
  bVar3 = local_138->useCreateHelper;
  bVar4 = local_138->useProgramUniform;
  uVar5 = local_138->field_0x7;
  iVar8 = (local_138->varyings).count;
  DVar11 = (local_138->varyings).type;
  DVar6 = (local_138->varyings).type;
  BVar17 = (local_138->varyings).binding;
  VVar12 = (local_138->varyings).vtxInterp;
  VVar13 = (local_138->varyings).frgInterp;
  (this->m_params).initSingle = local_138->initSingle;
  (this->m_params).switchVtx = bVar7;
  (this->m_params).switchFrg = bVar18;
  (this->m_params).useUniform = bVar1;
  (this->m_params).useSameName = bVar2;
  (this->m_params).useCreateHelper = bVar3;
  (this->m_params).useProgramUniform = bVar4;
  (this->m_params).field_0x7 = uVar5;
  (this->m_params).varyings.count = iVar8;
  (this->m_params).varyings.type = DVar11;
  (this->m_params).varyings.type = DVar6;
  (this->m_params).varyings.binding = BVar17;
  (this->m_params).varyings.vtxInterp = VVar12;
  (this->m_params).varyings.frgInterp = VVar13;
  this->m_testFunc = (TestFunc)local_158;
  *(undefined8 *)&this->field_0xb8 = uStack_150;
  dVar9 = deUint32Hash((uint)local_138->useProgramUniform << 6 |
                       (uint)local_138->useCreateHelper << 5 |
                       (uint)local_138->useSameName << 4 |
                       (uint)local_138->initSingle + (uint)local_138->switchVtx * 2 +
                       (uint)local_138->switchFrg * 4 + (uint)local_138->useUniform * 8);
  dVar9 = deUint32Hash(dVar9 + (pTVar16->varyings).count);
  dVar9 = deUint32Hash(dVar9 + (pTVar16->varyings).type);
  dVar9 = deUint32Hash(dVar9 + (pTVar16->varyings).binding);
  dVar9 = deUint32Hash(dVar9 + (pTVar16->varyings).vtxInterp);
  dVar9 = deUint32Hash(dVar9 + (pTVar16->varyings).frgInterp);
  deRandom_init(&(this->m_rnd).m_rnd,dVar9);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"// ",(allocator<char> *)&ndxStr);
  local_158 = &(this->m_rnd).m_rnd;
  tcu::ResultCollector::ResultCollector(&this->m_status,log,(string *)&local_90);
  pTVar16 = local_138;
  std::__cxx11::string::~string((string *)&local_90);
  local_130 = &this->m_varyings;
  (this->m_varyings).frgInputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_varyings).frgInputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_varyings).vtxOutputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_varyings).frgInputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_varyings).vtxOutputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_varyings).vtxOutputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = &(this->m_varyings).frgInputs;
  local_15c = 0;
  iVar8 = 0;
  do {
    if ((pTVar16->varyings).count <= local_15c) {
LAB_01245ba3:
      (this->m_fullProg).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      .m_data.ptr = (ProgramWrapper *)0x0;
      (this->m_vtxProg).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      .m_data.ptr = (ProgramWrapper *)0x0;
      (this->m_frgProg).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      .m_data.ptr = (ProgramWrapper *)0x0;
      return;
    }
    BVar17 = (pTVar16->varyings).binding;
    if (BVar17 == BINDING_LAST) {
      bVar7 = de::Random::getBool((Random *)local_158);
      BVar17 = (BindingKind)bVar7;
    }
    DVar11 = (pTVar16->varyings).type;
    if (DVar11 == TYPE_LAST) {
      dVar9 = deRandom_getUint32(local_158);
      dVar10 = deRandom_getUint32(local_158);
      if ((dVar9 & 7) == 0) {
        dVar9 = deRandom_getUint32(local_158);
        DVar11 = glu::getDataTypeMatrix(dVar10 % 3 + 2,dVar9 % 3 + 2);
      }
      else {
        DVar11 = de::Random::chooseWeighted<glu::DataType,glu::DataType_const*,float_const*>
                           ((Random *)local_158,
                            (DataType *)
                            Functional::(anonymous_namespace)::randomType(de::Random&)::s_types,
                            (DataType *)
                            Functional::(anonymous_namespace)::randomType(de::Random&)::s_weights,
                            (float *)Functional::(anonymous_namespace)::randomType(de::Random&)::
                                     s_weights);
        DVar11 = glu::getDataTypeVector(DVar11,(dVar10 & 3) + 1);
      }
    }
    rnd = local_158;
    VVar12 = chooseInterpolation((pTVar16->varyings).vtxInterp,DVar11,(Random *)local_158);
    VVar13 = chooseInterpolation((pTVar16->varyings).frgInterp,DVar11,(Random *)rnd);
    bVar18 = true;
    bVar7 = bVar18;
    if ((VVar12 != VARYINGINTERPOLATION_SMOOTH) && (VVar12 != VARYINGINTERPOLATION_DEFAULT)) {
      bVar7 = VVar12 == VARYINGINTERPOLATION_CENTROID;
    }
    if ((VVar13 != VARYINGINTERPOLATION_SMOOTH) && (VVar13 != VARYINGINTERPOLATION_DEFAULT)) {
      bVar18 = VVar13 == VARYINGINTERPOLATION_CENTROID;
    }
    if (bVar7 != bVar18) {
      VVar12 = VVar13;
    }
    location_ = -1;
    if (BVar17 == BINDING_LOCATION) {
      location_ = iVar8;
    }
    de::toString<int>(&ndxStr,&local_15c);
    if (BVar17 == BINDING_NAME) {
      std::operator+(&vtxName,"var",&ndxStr);
      __lhs = "var";
    }
    else {
      std::operator+(&vtxName,"vtxVar",&ndxStr);
      __lhs = "frgVar";
    }
    std::operator+(&frgName,__lhs,&ndxStr);
    glu::VarType::VarType(&varType,DVar11,PRECISION_HIGHP);
    iVar14 = glu::getDataTypeNumLocations(DVar11);
    iVar8 = iVar8 + iVar14;
    if (0x10 < iVar8) {
      glu::VarType::~VarType(&varType);
      std::__cxx11::string::~string((string *)&frgName);
      std::__cxx11::string::~string((string *)&vtxName);
      std::__cxx11::string::~string((string *)&ndxStr);
      this = local_140;
      goto LAB_01245ba3;
    }
    glu::Layout::Layout(&local_a4,location_,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    IVar15 = getGluInterpolation(VVar12);
    glu::VariableDeclaration::VariableDeclaration
              (&local_90,&varType,&vtxName,STORAGE_OUT,IVar15,&local_a4,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(&local_130->vtxOutputs,&local_90);
    glu::VariableDeclaration::~VariableDeclaration(&local_90);
    glu::Layout::Layout(&local_a4,location_,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    IVar15 = getGluInterpolation(VVar13);
    glu::VariableDeclaration::VariableDeclaration
              (&local_90,&varType,&frgName,STORAGE_IN,IVar15,&local_a4,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(local_128,&local_90);
    glu::VariableDeclaration::~VariableDeclaration(&local_90);
    glu::VarType::~VarType(&varType);
    std::__cxx11::string::~string((string *)&frgName);
    std::__cxx11::string::~string((string *)&vtxName);
    std::__cxx11::string::~string((string *)&ndxStr);
    local_15c = local_15c + 1;
    pTVar16 = local_138;
    this = local_140;
  } while( true );
}

Assistant:

SeparateShaderTest::SeparateShaderTest (Context&			ctx,
										const string&		name,
										const string&		description,
										int					iterations,
										const TestParams&	params,
										TestFunc			testFunc)
	: TestCase			(ctx, name.c_str(), description.c_str())
	, CallLogWrapper	(ctx.getRenderContext().getFunctions(), log())
	, m_iterations		(iterations)
	, m_currentIteration(0)
	, m_params			(params)
	, m_testFunc		(testFunc)
	, m_rnd				(paramsSeed(params))
	, m_status			(log(), "// ")
	, m_varyings		(genVaryingInterface(params.varyings, m_rnd))
{
	DE_ASSERT(paramsValid(params));
	DE_ASSERT(varyingsValid(m_varyings));
}